

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoopStatement.cpp
# Opt level: O2

string * __thiscall
ninx::parser::element::NoopStatement::dump_abi_cxx11_
          (string *__return_storage_ptr__,NoopStatement *this,int level)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_30,(char)level);
  std::operator+(__return_storage_ptr__,&local_30," NOOP");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::NoopStatement::dump(int level) const {
    return std::string(level, '\t')+" NOOP";
}